

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O0

void ngram_fwdtree_finish(ngram_search_t *ngs)

{
  uint frame_idx;
  long lVar1;
  double dVar2;
  double n_speech;
  chan_t **acl;
  chan_t *hmm;
  root_chan_t *rhmm;
  int32 *awl;
  int local_18;
  int32 cf;
  int32 w;
  int32 i;
  ngram_search_t *ngs_local;
  
  frame_idx = ((ngs->base).acmod)->output_frame;
  ngram_search_mark_bptable(ngs,frame_idx);
  hmm = (chan_t *)ngs->root_chan;
  for (cf = ngs->n_root_chan; 0 < cf; cf = cf + -1) {
    hmm_clear(&hmm->hmm);
    hmm = hmm + 1;
  }
  n_speech = (double)ngs->active_chan_list[(int)(frame_idx & 1)];
  acl = *(chan_t ***)n_speech;
  for (cf = ngs->n_active_chan[(int)(frame_idx & 1)]; n_speech = (double)((long)n_speech + 8),
      0 < cf; cf = cf + -1) {
    hmm_clear((hmm_t *)acl);
    acl = *(chan_t ***)n_speech;
  }
  rhmm = (root_chan_t *)ngs->active_word_list[(int)(frame_idx & 1)];
  local_18 = *(int *)&(rhmm->hmm).ctx;
  for (cf = ngs->n_active_word[(int)(frame_idx & 1)];
      rhmm = (root_chan_t *)((long)&(rhmm->hmm).ctx + 4), 0 < cf; cf = cf + -1) {
    if ((((ngs->base).dict)->word[local_18].pronlen != 1) &&
       (ngs->word_active[local_18 / 0x20] =
             ngs->word_active[local_18 / 0x20] &
             ((uint)(1L << ((byte)local_18 & 0x1f)) ^ 0xffffffff),
       ngs->word_chan[local_18] != (chan_t *)0x0)) {
      ngram_search_free_all_rc(ngs,local_18);
    }
    local_18 = *(int *)&(rhmm->hmm).ctx;
  }
  ptmr_stop(&ngs->fwdtree_perf);
  if (0 < (int)frame_idx) {
    lVar1 = ps_config_int((ngs->base).config,"frate");
    dVar2 = (double)(int)(frame_idx + 1) / (double)lVar1;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x60d,"%8d words recognized (%d/fr)\n",(ulong)(uint)ngs->bpidx,
            (long)(ngs->bpidx + ((int)frame_idx >> 1)) / (long)(int)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x60f,"%8d senones evaluated (%d/fr)\n",(ulong)(uint)(ngs->st).n_senone_active_utt,
            (long)((ngs->st).n_senone_active_utt + ((int)frame_idx >> 1)) /
            (long)(int)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x613,"%8d channels searched (%d/fr), %d 1st, %d last\n",
            (ulong)(uint)((ngs->st).n_root_chan_eval + (ngs->st).n_nonroot_chan_eval),
            (long)((ngs->st).n_root_chan_eval + (ngs->st).n_nonroot_chan_eval) /
            (long)(int)(frame_idx + 1) & 0xffffffff,(ngs->st).n_root_chan_eval,
            (ngs->st).n_last_chan_eval);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x616,"%8d words for which last channels evaluated (%d/fr)\n",
            (ulong)(uint)(ngs->st).n_word_lastchan_eval,
            (long)(ngs->st).n_word_lastchan_eval / (long)(int)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x618,"%8d candidate words for entering last phone (%d/fr)\n",
            (ulong)(uint)(ngs->st).n_lastphn_cand_utt,
            (long)(ngs->st).n_lastphn_cand_utt / (long)(int)(frame_idx + 1) & 0xffffffff);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x61b,"fwdtree %.2f CPU %.3f xRT\n",(ngs->fwdtree_perf).t_cpu,
            (double)(ngs->fwdtree_perf).t_cpu / dVar2);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
            ,0x61e,"fwdtree %.2f wall %.3f xRT\n",(ngs->fwdtree_perf).t_elapsed,
            (double)(ngs->fwdtree_perf).t_elapsed / dVar2);
  }
  return;
}

Assistant:

void
ngram_fwdtree_finish(ngram_search_t *ngs)
{
    int32 i, w, cf, *awl;
    root_chan_t *rhmm;
    chan_t *hmm, **acl;

    /* This is the number of frames processed. */
    cf = ps_search_acmod(ngs)->output_frame;
    /* Add a mark in the backpointer table for one past the final frame. */
    ngram_search_mark_bptable(ngs, cf);

    /* Deactivate channels lined up for the next frame */
    /* First, root channels of HMM tree */
    for (i = ngs->n_root_chan, rhmm = ngs->root_chan; i > 0; --i, rhmm++) {
        hmm_clear(&rhmm->hmm);
    }

    /* nonroot channels of HMM tree */
    i = ngs->n_active_chan[cf & 0x1];
    acl = ngs->active_chan_list[cf & 0x1];
    for (hmm = *(acl++); i > 0; --i, hmm = *(acl++)) {
        hmm_clear(&hmm->hmm);
    }

    /* word channels */
    i = ngs->n_active_word[cf & 0x1];
    awl = ngs->active_word_list[cf & 0x1];
    for (w = *(awl++); i > 0; --i, w = *(awl++)) {
        /* Don't accidentally free single-phone words! */
        if (dict_is_single_phone(ps_search_dict(ngs), w))
            continue;
        bitvec_clear(ngs->word_active, w);
        if (ngs->word_chan[w] == NULL)
            continue;
        ngram_search_free_all_rc(ngs, w);
    }

    /*
     * The previous search code did a postprocessing of the
     * backpointer table here, but we will postpone this until it is
     * absolutely necessary, i.e. when generating a word graph.
     * Likewise we don't actually have to decide what the exit word is
     * until somebody requests a backtrace.
     */

    ptmr_stop(&ngs->fwdtree_perf);
    /* Print out some statistics. */
    if (cf > 0) {
        double n_speech = (double)(cf + 1)
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("%8d words recognized (%d/fr)\n",
               ngs->bpidx, (ngs->bpidx + (cf >> 1)) / (cf + 1));
        E_INFO("%8d senones evaluated (%d/fr)\n", ngs->st.n_senone_active_utt,
               (ngs->st.n_senone_active_utt + (cf >> 1)) / (cf + 1));
        E_INFO("%8d channels searched (%d/fr), %d 1st, %d last\n",
               ngs->st.n_root_chan_eval + ngs->st.n_nonroot_chan_eval,
               (ngs->st.n_root_chan_eval + ngs->st.n_nonroot_chan_eval) / (cf + 1),
               ngs->st.n_root_chan_eval, ngs->st.n_last_chan_eval);
        E_INFO("%8d words for which last channels evaluated (%d/fr)\n",
               ngs->st.n_word_lastchan_eval,
               ngs->st.n_word_lastchan_eval / (cf + 1));
        E_INFO("%8d candidate words for entering last phone (%d/fr)\n",
               ngs->st.n_lastphn_cand_utt, ngs->st.n_lastphn_cand_utt / (cf + 1));
        E_INFO("fwdtree %.2f CPU %.3f xRT\n",
               ngs->fwdtree_perf.t_cpu,
               ngs->fwdtree_perf.t_cpu / n_speech);
        E_INFO("fwdtree %.2f wall %.3f xRT\n",
               ngs->fwdtree_perf.t_elapsed,
               ngs->fwdtree_perf.t_elapsed / n_speech);
    }
    /* dump_bptable(ngs); */
}